

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_binary.cpp
# Opt level: O1

string * flatbuffers::anon_unknown_5::BinaryFileName
                   (string *__return_storage_ptr__,Parser *parser,string *path,string *file_name)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  string ext;
  long *local_78 [2];
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  sVar1 = (parser->file_extension_)._M_string_length;
  local_78[0] = local_68;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"bin","");
  }
  else {
    pcVar2 = (parser->file_extension_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_78,pcVar2,pcVar2 + sVar1);
  }
  std::operator+(&local_38,path,file_name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_48 = *plVar5;
    lStack_40 = plVar4[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar5;
    local_58 = (long *)*plVar4;
  }
  local_50 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78[0]);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string BinaryFileName(const Parser &parser, const std::string &path,
                                  const std::string &file_name) {
  auto ext = parser.file_extension_.length() ? parser.file_extension_ : "bin";
  return path + file_name + "." + ext;
}